

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  
  InitTestEngine((TestFailEventListener)0x0);
  cVar2 = clock();
  run_all_fps_compression_tests();
  run_all_int_compression_tests();
  run_all_trico_compression_tests();
  cVar3 = clock();
  if (testing_fails == 0) {
    printf("Succes: %d tests passed.",(ulong)(uint)testing_success);
  }
  else {
    printf("FAILURE: %d out of %d tests failed (%d failures).",(ulong)(uint)testing_fails,
           (ulong)(uint)(testing_success + testing_fails));
  }
  putchar(10);
  printf("Test time: %f seconds.",(double)(cVar3 - cVar2) / 1000000.0);
  putchar(10);
  iVar1 = CloseTestEngine(true);
  return iVar1;
}

Assistant:

int main(int /*argc*/, const char* /*argv*/[])
  {
  InitTestEngine();

  auto tic = std::clock();
  run_all_fps_compression_tests();
  run_all_int_compression_tests();
  run_all_trico_compression_tests();
  auto toc = std::clock();

  if (!testing_fails) 
    {
    TEST_OUTPUT_LINE("Succes: %d tests passed.", testing_success);
    }
  else 
    {
    TEST_OUTPUT_LINE("FAILURE: %d out of %d tests failed (%d failures).", testing_fails, testing_success+testing_fails, testing_fails);
    }
  TEST_OUTPUT_LINE("Test time: %f seconds.", (double)(toc - tic)/(double)CLOCKS_PER_SEC);
  return CloseTestEngine(true);
  }